

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_arm.c
# Opt level: O3

uc_err reg_read_arm(void *_env,int mode,uint regid,void *value,size_t *size)

{
  uc_err uVar1;
  uint32_t uVar2;
  long lVar3;
  uint uVar4;
  
  if (regid - 0x42 < 0xd) {
    if (3 < *size) {
      *size = 4;
      uVar4 = *(uint *)((long)_env + (ulong)(regid - 0x42) * 4);
      goto LAB_00490457;
    }
  }
  else if (regid - 0x32 < 0x10) {
    if (0xf < *size) {
      *size = 0x10;
      lVar3 = (ulong)(regid - 0x32) * 0x10;
      *(undefined8 *)value = *(undefined8 *)((long)_env + lVar3 + 0xc10);
      *(undefined8 *)((long)value + 8) = *(undefined8 *)((long)_env + lVar3 + 0xc18);
      return UC_ERR_OK;
    }
  }
  else if (regid - 0xe < 0x20) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)value =
           *(undefined8 *)
            ((long)_env + (ulong)(regid & 1) * 8 + (ulong)(regid - 0xe >> 1) * 0x10 + 0xc10);
      return UC_ERR_OK;
    }
  }
  else {
    uVar4 = regid - 0x4f;
    if (uVar4 < 0x20) {
      if (3 < *size) {
        *size = 4;
        *(int *)value =
             (int)(*(ulong *)((long)_env +
                             (ulong)(uVar4 & 2) * 4 + (ulong)(uVar4 >> 2) * 0x10 + 0xc10) >>
                  ((char)uVar4 * ' ' & 0x3fU));
        return UC_ERR_OK;
      }
    }
    else {
      uVar1 = UC_ERR_ARG;
      switch(regid) {
      case 0x6f:
        if (3 < *size) {
          *size = 4;
          uVar4 = *(uint *)((long)_env + 0x2c0);
          goto LAB_00490457;
        }
        break;
      case 0x70:
      case 0x7f:
      case 0x80:
      case 0x81:
      case 0x82:
      case 0x83:
      case 0x84:
      case 0x85:
      case 0x86:
      case 0x87:
      case 0x88:
      case 0x89:
      case 0x8a:
        goto switchD_00490526_caseD_70;
      case 0x71:
        if (3 < *size) {
          *size = 4;
          uVar4 = *(uint *)((long)_env + 0x548);
          goto LAB_00490457;
        }
        break;
      case 0x72:
        if (3 < *size) {
          *size = 4;
          uVar2 = 5;
LAB_004906d2:
          uVar4 = v7m_mrs_xpsr((CPUARMState *)_env,uVar2);
LAB_00490457:
          *(uint *)value = uVar4;
          return UC_ERR_OK;
        }
        break;
      case 0x73:
        if (3 < *size) {
          *size = 4;
          uVar2 = 8;
LAB_004906f0:
          uVar4 = helper_v7m_mrs_arm((CPUARMState *)_env,uVar2);
          goto LAB_00490457;
        }
        break;
      case 0x74:
        if (3 < *size) {
          *size = 4;
          uVar2 = 9;
          goto LAB_004906f0;
        }
        break;
      case 0x75:
        if (3 < *size) {
          *size = 4;
          uVar2 = 0x14;
          goto LAB_004906f0;
        }
        break;
      case 0x76:
        if (3 < *size) {
          *size = 4;
          uVar2 = 1;
          goto LAB_004906d2;
        }
        break;
      case 0x77:
        if (3 < *size) {
          *size = 4;
          uVar2 = 2;
          goto LAB_004906d2;
        }
        break;
      case 0x78:
        if (3 < *size) {
          *size = 4;
          uVar2 = 3;
          goto LAB_004906d2;
        }
        break;
      case 0x79:
        if (3 < *size) {
          *size = 4;
          uVar2 = 6;
          goto LAB_004906d2;
        }
        break;
      case 0x7a:
        if (3 < *size) {
          *size = 4;
          uVar2 = 7;
          goto LAB_004906d2;
        }
        break;
      case 0x7b:
        if (3 < *size) {
          *size = 4;
          uVar2 = 0x10;
          goto LAB_004906f0;
        }
        break;
      case 0x7c:
        if (3 < *size) {
          *size = 4;
          uVar2 = 0x11;
          goto LAB_004906f0;
        }
        break;
      case 0x7d:
        if (3 < *size) {
          *size = 4;
          uVar2 = 0x12;
          goto LAB_004906f0;
        }
        break;
      case 0x7e:
        if (3 < *size) {
          *size = 4;
          uVar2 = 0x13;
          goto LAB_004906f0;
        }
        break;
      case 0x8b:
        if (0x27 < *size) {
          *size = 0x28;
          uVar1 = read_cp_reg((CPUARMState *)_env,(uc_arm_cp_reg *)value);
          return uVar1;
        }
        break;
      default:
        switch(regid) {
        case 1:
          if ((*(byte *)((long)_env + 0xfa1) & 2) == 0) {
            if (3 < *size) {
              *size = 4;
              uVar2 = cpsr_read_arm((CPUARMState *)_env);
              uVar4 = uVar2 & 0xf80f0000;
              goto LAB_00490457;
            }
          }
          else if (3 < *size) {
            *size = 4;
            uVar2 = v7m_mrs_xpsr((CPUARMState *)_env,0);
            *(uint32_t *)value = uVar2;
            return UC_ERR_OK;
          }
          break;
        case 2:
          if (3 < *size) {
            *size = 4;
            uVar2 = cpsr_read_arm((CPUARMState *)_env);
            uVar4 = uVar2 & 0xf0000000;
            goto LAB_00490457;
          }
          break;
        case 3:
          if (3 < *size) {
            *size = 4;
            uVar4 = cpsr_read_arm((CPUARMState *)_env);
            goto LAB_00490457;
          }
          break;
        case 4:
          if (3 < *size) {
            *size = 4;
            uVar4 = *(uint *)((long)_env + 0xe48);
            goto LAB_00490457;
          }
          break;
        default:
          goto switchD_00490526_caseD_70;
        case 6:
          if (3 < *size) {
            *size = 4;
            uVar4 = vfp_get_fpscr_arm((CPUARMState *)_env);
            goto LAB_00490457;
          }
          break;
        case 8:
          if (3 < *size) {
            *size = 4;
            uVar4 = *(uint *)((long)_env + 0xe28);
            goto LAB_00490457;
          }
          break;
        case 10:
          if (3 < *size) {
            *size = 4;
            uVar4 = *(uint *)((long)_env + 0x38);
            goto LAB_00490457;
          }
          break;
        case 0xb:
          if (3 < *size) {
            *size = 4;
            uVar4 = *(uint *)((long)_env + 0x3c);
            goto LAB_00490457;
          }
          break;
        case 0xc:
          if (3 < *size) {
            *size = 4;
            uVar4 = *(uint *)((long)_env + 0x34);
            goto LAB_00490457;
          }
          break;
        case 0xd:
          if (3 < *size) {
            *size = 4;
            uVar4 = *(uint *)((long)_env + 0x158);
            goto LAB_00490457;
          }
        }
      }
    }
  }
  uVar1 = UC_ERR_OVERFLOW;
switchD_00490526_caseD_70:
  return uVar1;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUARMState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_ARM_REG_R0 && regid <= UC_ARM_REG_R12) {
        CHECK_REG_TYPE(uint32_t);
        *(uint32_t *)value = env->regs[regid - UC_ARM_REG_R0];
    } else if (regid >= UC_ARM_REG_Q0 && regid <= UC_ARM_REG_Q15) {
        CHECK_REG_TYPE(uint64_t[2]);
        uint32_t reg_index = regid - UC_ARM_REG_Q0;
        *(uint64_t *)value = env->vfp.zregs[reg_index].d[0];
        *(((uint64_t *)value) + 1) = env->vfp.zregs[reg_index].d[1];
    } else if (regid >= UC_ARM_REG_D0 && regid <= UC_ARM_REG_D31) {
        CHECK_REG_TYPE(uint64_t);
        uint32_t reg_index = regid - UC_ARM_REG_D0;
        *(uint64_t *)value = env->vfp.zregs[reg_index / 2].d[reg_index & 1];
    } else if (regid >= UC_ARM_REG_S0 && regid <= UC_ARM_REG_S31) {
        CHECK_REG_TYPE(uint32_t);
        uint32_t reg_index = regid - UC_ARM_REG_S0;
        uint64_t reg_value = env->vfp.zregs[reg_index / 4].d[reg_index % 4 / 2];

        if (reg_index % 2 == 0) {
            *(uint32_t *)value = (uint32_t)(reg_value & 0xffffffff);
        } else {
            *(uint32_t *)value = (uint32_t)(reg_value >> 32);
        }
    } else {
        switch (regid) {
        case UC_ARM_REG_APSR:
            if (arm_feature(env, ARM_FEATURE_M)) {
                CHECK_REG_TYPE(int32_t);
                *(int32_t *)value = v7m_mrs_xpsr(env, 0);
            } else {
                CHECK_REG_TYPE(int32_t);
                *(int32_t *)value =
                    cpsr_read(env) & (CPSR_NZCV | CPSR_Q | CPSR_GE);
            }
            break;
        case UC_ARM_REG_APSR_NZCV:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = cpsr_read(env) & CPSR_NZCV;
            break;
        case UC_ARM_REG_CPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = cpsr_read(env);
            break;
        case UC_ARM_REG_SPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->spsr;
            break;
        // case UC_ARM_REG_SP:
        case UC_ARM_REG_R13:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->regs[13];
            break;
        // case UC_ARM_REG_LR:
        case UC_ARM_REG_R14:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->regs[14];
            break;
        // case UC_ARM_REG_PC:
        case UC_ARM_REG_R15:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->regs[15];
            break;
        case UC_ARM_REG_C1_C0_2:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->cp15.cpacr_el1;
            break;
        case UC_ARM_REG_C13_C0_3:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->cp15.tpidrro_el[0];
            break;
        case UC_ARM_REG_FPEXC:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->vfp.xregs[ARM_VFP_FPEXC];
            break;
        case UC_ARM_REG_FPSCR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = vfp_get_fpscr(env);
            break;
        case UC_ARM_REG_FPSID:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = env->vfp.xregs[ARM_VFP_FPSID];
            break;
        case UC_ARM_REG_IPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 5);
            break;
        case UC_ARM_REG_MSP:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 8);
            break;
        case UC_ARM_REG_PSP:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 9);
            break;
        case UC_ARM_REG_IAPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 1);
            break;
        case UC_ARM_REG_EAPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 2);
            break;
        case UC_ARM_REG_XPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 3);
            break;
        case UC_ARM_REG_EPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 6);
            break;
        case UC_ARM_REG_IEPSR:
            CHECK_REG_TYPE(int32_t);
            *(int32_t *)value = v7m_mrs_xpsr(env, 7);
            break;
        case UC_ARM_REG_PRIMASK:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 16);
            break;
        case UC_ARM_REG_BASEPRI:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 17);
            break;
        case UC_ARM_REG_BASEPRI_MAX:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 18);
            break;
        case UC_ARM_REG_FAULTMASK:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 19);
            break;
        case UC_ARM_REG_CONTROL:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = helper_v7m_mrs(env, 20);
            break;
        case UC_ARM_REG_CP_REG:
            CHECK_REG_TYPE(uc_arm_cp_reg);
            ret = read_cp_reg(env, (uc_arm_cp_reg *)value);
            break;
        }
    }

    return ret;
}